

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O2

void def_check(int *shielding,bool *defend,int *damage)

{
  ostream *poVar1;
  
  if (*shielding == 0) {
    if (*defend == true) {
      poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_133ec);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)((double)*damage * 0.6));
      poVar1 = std::operator<<(poVar1,anon_var_dwarf_13444 + 0x14);
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      *damage = (int)((double)*damage * 0.4);
      *defend = false;
    }
  }
  else if (0 < *shielding) {
    if (*defend != false) {
      poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_13444);
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      *defend = false;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_13418);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*damage);
    poVar1 = std::operator<<(poVar1,anon_var_dwarf_1342e);
    std::endl<char,std::char_traits<char>>(poVar1);
    *damage = 0;
  }
  return;
}

Assistant:

void def_check(int* shielding,bool* defend,int* damage){
    if(*shielding==0&&*defend==true)
    {
        cout<<"勇者防禦住了 "<<int(*damage*0.6)<<" 點傷害"<<endl<<endl;
        *damage=*damage*0.4;
        *defend=false;
    }
    else if(*shielding>0&&*defend==false)
    {
        cout<<"(護盾吸收了 "<<*damage<<" 點傷害)"<<endl;
        *damage=0;
    }
    else if(*shielding>0&&*defend==true)
    {
        cout<<"勇者防禦住了 0 點傷害"<<endl<<endl;
        *defend=false;
        cout<<"(護盾吸收了 "<<*damage<<" 點傷害)"<<endl;
        *damage=0;
    }
}